

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

QString * __thiscall
QSQLiteDriver::stripDelimiters
          (QString *__return_storage_ptr__,QSQLiteDriver *this,QString *identifier,
          IdentifierType type)

{
  char16_t cVar1;
  char16_t *pcVar2;
  long lVar3;
  Data *pDVar4;
  char cVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  QStringView local_60;
  QStringView local_50;
  undefined1 local_40 [16];
  QStringView *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = (identifier->d).ptr;
  local_40._0_8_ = (identifier->d).size;
  uVar6 = QStringView::indexOf((QStringView *)local_40,(QChar)0x2e,0,CaseSensitive);
  if ((long)uVar6 < 0) {
LAB_0011629b:
    cVar5 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type);
    if (cVar5 == '\0') {
      pDVar4 = (identifier->d).d;
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr = (identifier->d).ptr;
      (__return_storage_ptr__->d).size = (identifier->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      QString::mid((longlong)__return_storage_ptr__,(longlong)identifier);
    }
  }
  else {
    pcVar2 = (identifier->d).ptr;
    lVar3 = (identifier->d).size;
    local_60.m_data = pcVar2 + uVar6 + 1;
    local_60.m_size = lVar3 - (uVar6 + 1);
    if (uVar6 < 3) {
LAB_001161f3:
      bVar7 = false;
    }
    else {
      cVar1 = *pcVar2;
      if (cVar1 == L'`') {
        bVar7 = true;
        if (pcVar2[uVar6 - 1] != L'`') goto LAB_001161f3;
      }
      else if (cVar1 == L'[') {
        bVar7 = pcVar2[uVar6 - 1] == L']';
      }
      else if ((cVar1 != L'\"') || (bVar7 = true, pcVar2[uVar6 - 1] != L'\"')) goto LAB_001161f3;
    }
    local_50.m_size = uVar6;
    local_50.m_data = pcVar2;
    if (local_60.m_size < 3) {
LAB_00116238:
      bVar8 = false;
LAB_0011623b:
      if (!(bool)(bVar7 | bVar8)) goto LAB_0011629b;
    }
    else {
      cVar1 = *local_60.m_data;
      if (cVar1 == L'`') {
        bVar8 = true;
        if (pcVar2[lVar3 + -1] != L'`') goto LAB_00116238;
      }
      else {
        if (cVar1 == L'[') {
          bVar8 = pcVar2[lVar3 + -1] == L']';
          goto LAB_0011623b;
        }
        if ((cVar1 != L'\"') || (bVar8 = true, pcVar2[lVar3 + -1] != L'\"')) goto LAB_00116238;
      }
    }
    if (bVar7) {
      local_50.m_data = pcVar2 + 1;
      local_50.m_size = uVar6 - 2;
    }
    if (bVar8) {
      local_60.m_data = pcVar2 + uVar6 + 2;
      local_60.m_size = local_60.m_size + -2;
    }
    local_40._0_8_ = &local_50;
    local_40._8_2_ = 0x2e;
    local_30 = &local_60;
    QStringBuilder<QStringBuilder<QStringView_&,_char16_t>,_QStringView_&>::convertTo<QString>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<QStringView_&,_char16_t>,_QStringView_&> *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSQLiteDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const auto leftEscaped = d->isIdentifierEscaped(leftName);
        const auto rightEscaped = d->isIdentifierEscaped(rightName);
        if (leftEscaped || rightEscaped) {
            if (leftEscaped)
                leftName = leftName.sliced(1).chopped(1);
            if (rightEscaped)
                rightName = rightName.sliced(1).chopped(1);
            return leftName + u'.' + rightName;
        }
    }

    if (isIdentifierEscaped(identifier, type))
        return identifier.mid(1, identifier.size() - 2);

    return identifier;
}